

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float ImGuiStb::STB_TEXTEDIT_GETWIDTH(ImGuiTextEditState *obj,int line_start_idx,int char_idx)

{
  ushort uVar1;
  ImFont *pIVar2;
  float *pfVar3;
  
  if ((obj->Text).Size <= line_start_idx + char_idx) {
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                  ,0x35b,
                  "value_type &ImVector<unsigned short>::operator[](int) [T = unsigned short]");
  }
  uVar1 = (obj->Text).Data[line_start_idx + char_idx];
  if (uVar1 == 10) {
    return -1.0;
  }
  pIVar2 = GImGui->Font;
  pfVar3 = &pIVar2->FallbackXAdvance;
  if ((int)(uint)uVar1 < (pIVar2->IndexXAdvance).Size) {
    pfVar3 = (float *)((ulong)((uint)uVar1 * 4) + (long)(pIVar2->IndexXAdvance).Data);
  }
  return (GImGui->FontSize / pIVar2->FontSize) * *pfVar3;
}

Assistant:

static float   STB_TEXTEDIT_GETWIDTH(STB_TEXTEDIT_STRING* obj, int line_start_idx, int char_idx)  { ImWchar c = obj->Text[line_start_idx+char_idx]; if (c == '\n') return STB_TEXTEDIT_GETWIDTH_NEWLINE; return GImGui->Font->GetCharAdvance(c) * (GImGui->FontSize / GImGui->Font->FontSize); }